

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_parse_sig_alg_ext(mbedtls_ssl_context *ssl,uchar *buf,uchar *end)

{
  ushort *puVar1;
  ushort uVar2;
  uint16_t uVar3;
  mbedtls_ssl_handshake_params *pmVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  uint16_t *puVar8;
  char *pcVar9;
  int iVar10;
  ushort *puVar11;
  uchar alert_type;
  ushort *puVar12;
  int iVar13;
  ushort in;
  bool bVar14;
  
  if (end < buf || (ulong)((long)end - (long)buf) < 2) {
    iVar10 = 0x1738;
LAB_0020d0c8:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,iVar10,"missing input data in %s","mbedtls_ssl_parse_sig_alg_ext");
  }
  else {
    uVar2 = *(ushort *)buf;
    uVar6 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
    puVar12 = (ushort *)(buf + 2);
    pmVar4 = ssl->handshake;
    pmVar4->received_sig_algs[8] = 0;
    pmVar4->received_sig_algs[9] = 0;
    pmVar4->received_sig_algs[10] = 0;
    pmVar4->received_sig_algs[0xb] = 0;
    pmVar4->received_sig_algs[0xc] = 0;
    pmVar4->received_sig_algs[0xd] = 0;
    pmVar4->received_sig_algs[0xe] = 0;
    pmVar4->received_sig_algs[0xf] = 0;
    pmVar4->received_sig_algs[0] = 0;
    pmVar4->received_sig_algs[1] = 0;
    pmVar4->received_sig_algs[2] = 0;
    pmVar4->received_sig_algs[3] = 0;
    pmVar4->received_sig_algs[4] = 0;
    pmVar4->received_sig_algs[5] = 0;
    pmVar4->received_sig_algs[6] = 0;
    pmVar4->received_sig_algs[7] = 0;
    pmVar4->received_sig_algs[0x10] = 0;
    pmVar4->received_sig_algs[0x11] = 0;
    pmVar4->received_sig_algs[0x12] = 0;
    pmVar4->received_sig_algs[0x13] = 0;
    if (end < puVar12 || (ulong)((long)end - (long)puVar12) < uVar6) {
      iVar10 = 0x173f;
      goto LAB_0020d0c8;
    }
    if (uVar2 == 0) {
      if (puVar12 != (ushort *)end) goto LAB_0020d106;
LAB_0020d143:
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1762,"no signature algorithm in common");
      iVar13 = -0x6e00;
      alert_type = '(';
      iVar10 = -0x6e00;
      goto LAB_0020d0e5;
    }
    puVar11 = (ushort *)(buf + uVar6);
    uVar5 = 0;
    do {
      while( true ) {
        if ((ulong)((long)puVar11 + (2 - (long)puVar12)) < 2) {
          iVar10 = 0x1742;
          goto LAB_0020d0c8;
        }
        uVar2 = *puVar12;
        in = uVar2 << 8 | uVar2 >> 8;
        puVar1 = puVar12 + 1;
        pcVar7 = mbedtls_ssl_sig_alg_to_str(in);
        mbedtls_debug_print_msg
                  (ssl,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1747,"received signature algorithm: 0x%x %s",(ulong)in,pcVar7);
        if (ssl->tls_version != MBEDTLS_SSL_VERSION_TLS1_2) break;
        if ((((char)(uVar2 >> 8) == '\x03') && (0xfd < (byte)((char)uVar2 - 5U))) &&
           (((pmVar4 = ssl->handshake, pmVar4 != (mbedtls_ssl_handshake_params *)0x0 &&
             ((pmVar4->sig_algs_heap_allocated == '\x01' &&
              (puVar8 = pmVar4->sig_algs, puVar8 != (uint16_t *)0x0)))) ||
            (puVar8 = ssl->conf->sig_algs, puVar8 != (uint16_t *)0x0)))) {
          uVar3 = *puVar8;
          while (uVar3 != 0) {
            puVar8 = puVar8 + 1;
            if (uVar3 == in) goto LAB_0020cff3;
            uVar3 = *puVar8;
          }
        }
        bVar14 = puVar11 <= puVar12;
        puVar12 = puVar1;
        if (bVar14) goto LAB_0020d100;
      }
LAB_0020cff3:
      pcVar9 = mbedtls_ssl_sig_alg_to_str(in);
      mbedtls_debug_print_msg
                (ssl,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1751,"valid signature algorithm: %s",pcVar9,pcVar7);
      if (uVar5 + 1 < 0x14) {
        ssl->handshake->received_sig_algs[uVar5] = in;
        uVar5 = uVar5 + 1;
      }
      bVar14 = puVar12 < puVar11;
      puVar12 = puVar1;
    } while (bVar14);
LAB_0020d100:
    if (puVar1 == (ushort *)end) {
      if (uVar5 != 0) {
        ssl->handshake->received_sig_algs[uVar5] = 0;
        return 0;
      }
      goto LAB_0020d143;
    }
LAB_0020d106:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x175b,"Signature algorithms extension length misaligned");
  }
  iVar13 = -0x7300;
  alert_type = '2';
  iVar10 = -0x7300;
LAB_0020d0e5:
  mbedtls_ssl_pend_fatal_alert(ssl,alert_type,iVar10);
  return iVar13;
}

Assistant:

int mbedtls_ssl_parse_sig_alg_ext(mbedtls_ssl_context *ssl,
                                  const unsigned char *buf,
                                  const unsigned char *end)
{
    const unsigned char *p = buf;
    size_t supported_sig_algs_len = 0;
    const unsigned char *supported_sig_algs_end;
    uint16_t sig_alg;
    uint32_t common_idx = 0;

    MBEDTLS_SSL_CHK_BUF_READ_PTR(p, end, 2);
    supported_sig_algs_len = MBEDTLS_GET_UINT16_BE(p, 0);
    p += 2;

    memset(ssl->handshake->received_sig_algs, 0,
           sizeof(ssl->handshake->received_sig_algs));

    MBEDTLS_SSL_CHK_BUF_READ_PTR(p, end, supported_sig_algs_len);
    supported_sig_algs_end = p + supported_sig_algs_len;
    while (p < supported_sig_algs_end) {
        MBEDTLS_SSL_CHK_BUF_READ_PTR(p, supported_sig_algs_end, 2);
        sig_alg = MBEDTLS_GET_UINT16_BE(p, 0);
        p += 2;
        MBEDTLS_SSL_DEBUG_MSG(4, ("received signature algorithm: 0x%x %s",
                                  sig_alg,
                                  mbedtls_ssl_sig_alg_to_str(sig_alg)));
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if (ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_2 &&
            (!(mbedtls_ssl_sig_alg_is_supported(ssl, sig_alg) &&
               mbedtls_ssl_sig_alg_is_offered(ssl, sig_alg)))) {
            continue;
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

        MBEDTLS_SSL_DEBUG_MSG(4, ("valid signature algorithm: %s",
                                  mbedtls_ssl_sig_alg_to_str(sig_alg)));

        if (common_idx + 1 < MBEDTLS_RECEIVED_SIG_ALGS_SIZE) {
            ssl->handshake->received_sig_algs[common_idx] = sig_alg;
            common_idx += 1;
        }
    }
    /* Check that we consumed all the message. */
    if (p != end) {
        MBEDTLS_SSL_DEBUG_MSG(1,
                              ("Signature algorithms extension length misaligned"));
        MBEDTLS_SSL_PEND_FATAL_ALERT(MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR,
                                     MBEDTLS_ERR_SSL_DECODE_ERROR);
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    if (common_idx == 0) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("no signature algorithm in common"));
        MBEDTLS_SSL_PEND_FATAL_ALERT(MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE,
                                     MBEDTLS_ERR_SSL_HANDSHAKE_FAILURE);
        return MBEDTLS_ERR_SSL_HANDSHAKE_FAILURE;
    }

    ssl->handshake->received_sig_algs[common_idx] = MBEDTLS_TLS_SIG_NONE;
    return 0;
}